

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void print_expr_struct_debug(lyxp_expr *exp)

{
  byte *pbVar1;
  char *pcVar2;
  size_t sVar3;
  ushort uVar4;
  byte bVar5;
  ulong uVar6;
  char local_b8 [8];
  char tmp [128];
  
  if ('\x02' < ly_log_level) {
    if ('\x02' < ly_log_level) {
      ly_log_dbg(LY_LDGXPATH,"expression \"%s\":",exp->expr);
    }
    if (exp->used != 0) {
      uVar6 = 0;
      do {
        pcVar2 = print_token(exp->tokens[uVar6]);
        sprintf(local_b8,"\ttoken %s, in expression \"%.*s\"",pcVar2,(ulong)exp->tok_len[uVar6],
                exp->expr + exp->expr_pos[uVar6]);
        pbVar1 = exp->repeat[uVar6];
        if (pbVar1 != (byte *)0x0) {
          sVar3 = strlen(local_b8);
          sprintf(local_b8 + sVar3," (repeat %d",(ulong)*pbVar1);
          bVar5 = exp->repeat[uVar6][1];
          tmp._120_8_ = uVar6;
          if (bVar5 != 0) {
            uVar4 = 2;
            do {
              sVar3 = strlen(local_b8);
              sprintf(local_b8 + sVar3,", %d",(ulong)bVar5);
              bVar5 = exp->repeat[tmp._120_8_][uVar4];
              uVar4 = uVar4 + 1;
            } while (bVar5 != 0);
          }
          sVar3 = strlen(local_b8);
          (local_b8 + sVar3)[0] = ')';
          (local_b8 + sVar3)[1] = '\0';
          uVar6 = tmp._120_8_;
        }
        if ('\x02' < ly_log_level) {
          ly_log_dbg(LY_LDGXPATH,local_b8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < exp->used);
    }
  }
  return;
}

Assistant:

static void
print_expr_struct_debug(struct lyxp_expr *exp)
{
    uint16_t i, j;
    char tmp[128];

    if (!exp || (ly_log_level < LY_LLDBG)) {
        return;
    }

    LOGDBG(LY_LDGXPATH, "expression \"%s\":", exp->expr);
    for (i = 0; i < exp->used; ++i) {
        sprintf(tmp, "\ttoken %s, in expression \"%.*s\"", print_token(exp->tokens[i]), exp->tok_len[i],
               &exp->expr[exp->expr_pos[i]]);
        if (exp->repeat[i]) {
            sprintf(tmp + strlen(tmp), " (repeat %d", exp->repeat[i][0]);
            for (j = 1; exp->repeat[i][j]; ++j) {
                sprintf(tmp + strlen(tmp), ", %d", exp->repeat[i][j]);
            }
            strcat(tmp, ")");
        }
        LOGDBG(LY_LDGXPATH, tmp);
    }
}